

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O1

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  mode_t mVar6;
  int iVar7;
  wchar_t wVar8;
  char *pcVar9;
  la_int64_t lVar10;
  char *pcVar11;
  ulong uVar13;
  __off_t _Var14;
  __off_t __offset;
  int *piVar15;
  size_t __size;
  byte *pbVar16;
  long lVar17;
  ulong uVar18;
  stat s;
  int stflags;
  int local_10e4;
  int local_10e0;
  int local_10dc;
  ulong local_10d8;
  ulong local_10d0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  byte local_ff0 [4032];
  ssize_t sVar12;
  
  local_10e4 = fd;
  archive_clear_error(_a);
  pcVar9 = archive_entry_sourcepath(entry);
  if (pcVar9 == (char *)0x0) {
    pcVar9 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (local_10e4 < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar4 = lstat(pcVar9,(stat *)st);
          if (iVar4 != 0) {
            piVar15 = __errno_location();
            iVar4 = *piVar15;
            pcVar11 = "Can\'t lstat %s";
            goto LAB_0039c4c1;
          }
        }
        else {
          st = &local_10c8;
          iVar4 = stat(pcVar9,(stat *)st);
          if (iVar4 != 0) {
            piVar15 = __errno_location();
            iVar4 = *piVar15;
            pcVar11 = "Can\'t stat %s";
LAB_0039c4c1:
            archive_set_error(_a,iVar4,pcVar11,pcVar9);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar4 = fstat(local_10e4,(stat *)st);
        if (iVar4 != 0) {
          piVar15 = __errno_location();
          iVar4 = *piVar15;
          pcVar9 = "Can\'t fstat";
          goto LAB_0039c0fe;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar10 = archive_entry_uid(entry);
  pcVar11 = archive_read_disk_uname(_a,lVar10);
  if (pcVar11 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar11);
  }
  lVar10 = archive_entry_gid(entry);
  pcVar11 = archive_read_disk_gname(_a,lVar10);
  if (pcVar11 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar11);
  }
  if (((_a[1].file_count & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10e4 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar9,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar9,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10e4);
    }
    if (-1 < local_10e4) {
      iVar4 = ioctl(local_10e4,0x80086601,local_1038);
      if ((int)local_1038[0] != 0 && iVar4 == 0) {
        archive_entry_set_fflags(entry,(long)(int)local_1038[0],0);
      }
    }
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    __size = st->st_size + 1;
    pcVar11 = (char *)malloc(__size);
    if (pcVar11 == (char *)0x0) {
      pcVar9 = "Couldn\'t read link data";
      iVar4 = 0xc;
LAB_0039c0fe:
      archive_set_error(_a,iVar4,pcVar9);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar12 = readlink(pcVar9,pcVar11,__size);
      uVar5 = (uint)sVar12;
    }
    else {
      iVar4 = (**(code **)&_a[1].compression_code)();
      sVar12 = readlinkat(iVar4,pcVar9,pcVar11,__size);
      uVar5 = (uint)sVar12;
    }
    if ((int)uVar5 < 0) {
      piVar15 = __errno_location();
      archive_set_error(_a,*piVar15,"Couldn\'t read link data");
      free(pcVar11);
      return -0x19;
    }
    pcVar11[uVar5 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar11);
    free(pcVar11);
  }
  mVar6 = archive_entry_filetype(entry);
  iVar4 = 0;
  if (((mVar6 != 0x8000) || (lVar10 = archive_entry_size(entry), iVar4 = 0, lVar10 < 1)) ||
     (pcVar9 = archive_entry_hardlink(entry), pcVar9 != (char *)0x0)) goto LAB_0039c550;
  if (local_10e4 < 0) {
    pcVar9 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10e4);
  }
  else {
    pcVar9 = (char *)0x0;
  }
  if (local_10e4 < 0) {
    iVar4 = -0x19;
    if (pcVar9 == (char *)0x0) goto LAB_0039c550;
    local_10e4 = open(pcVar9,0x80800);
    if (-1 < local_10e4) {
      local_10e0 = fd;
      __archive_ensure_cloexec_flag(local_10e4);
      uVar18 = 0;
      goto LAB_0039c229;
    }
LAB_0039c60e:
    iVar4 = -0x19;
    piVar15 = __errno_location();
    archive_set_error(_a,*piVar15,"Can\'t open `%s\'",pcVar9);
  }
  else {
    local_10e0 = fd;
    uVar13 = lseek(local_10e4,0,1);
    uVar18 = 0;
    if (uVar13 != 0) {
      lseek(local_10e4,0,0);
      uVar18 = uVar13;
    }
LAB_0039c229:
    iVar4 = 0;
    _Var14 = lseek(local_10e4,0,4);
    if (-1 < _Var14) {
      if (_Var14 != 0) {
        lseek(local_10e4,0,0);
      }
      local_10d8 = uVar18;
      lVar10 = archive_entry_size(entry);
      if (lVar10 < 1) {
LAB_0039c4ef:
        iVar4 = 0;
      }
      else {
        _Var14 = 0;
        while (__offset = lseek(local_10e4,_Var14,3), __offset != -1) {
          _Var14 = lseek(local_10e4,__offset,4);
          if (_Var14 == -1) {
            piVar15 = __errno_location();
            if (*piVar15 == 6) {
              _Var14 = lseek(local_10e4,0,2);
              iVar4 = 0;
              if (_Var14 != -1) goto LAB_0039c53c;
            }
            iVar4 = *piVar15;
            pcVar9 = "lseek(SEEK_DATA) failed";
            goto LAB_0039c52c;
          }
          iVar4 = 0;
          if ((_Var14 == lVar10 && __offset == 0) ||
             (archive_entry_sparse_add_entry(entry,__offset,_Var14 - __offset), iVar4 = 0,
             lVar10 <= _Var14)) goto LAB_0039c53c;
        }
        piVar15 = __errno_location();
        iVar4 = *piVar15;
        if (iVar4 == 6) {
          wVar8 = archive_entry_sparse_count(entry);
          if (wVar8 != L'\0') goto LAB_0039c4ef;
          _Var14 = lseek(local_10e4,0,4);
          iVar4 = 0;
          if (_Var14 == 0) {
            _Var14 = lseek(local_10e4,0,2);
            iVar4 = 0;
            if (_Var14 == lVar10) {
              archive_entry_sparse_add_entry(entry,0,0);
              iVar4 = 0;
            }
          }
        }
        else {
          pcVar9 = "lseek(SEEK_HOLE) failed";
LAB_0039c52c:
          archive_set_error(_a,iVar4,pcVar9);
          iVar4 = -0x19;
        }
      }
LAB_0039c53c:
      lseek(local_10e4,local_10d8,0);
      fd = local_10e0;
      goto LAB_0039c550;
    }
    mVar6 = archive_entry_filetype(entry);
    fd = local_10e0;
    if (((mVar6 != 0x8000) ||
        (lVar10 = archive_entry_size(entry), fd = local_10e0, iVar4 = 0, lVar10 < 1)) ||
       (pcVar9 = archive_entry_hardlink(entry), pcVar9 != (char *)0x0)) goto LAB_0039c550;
    if (local_10e4 < 0) {
      pcVar9 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
      iVar4 = -0x19;
      if (pcVar9 == (char *)0x0) goto LAB_0039c550;
      if (*(long *)&_a[1].archive_format == 0) {
        local_10e4 = open(pcVar9,0x80800);
      }
      else {
        local_10e4 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar9,0x80800);
      }
      if (local_10e4 < 0) goto LAB_0039c60e;
      __archive_ensure_cloexec_flag(local_10e4);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    local_10d8 = archive_entry_size(entry);
    bVar2 = true;
    uVar18 = 0xc020660b;
    local_10dc = 0;
    local_10d0 = 0xc020660b;
    local_10e0 = fd;
    do {
      iVar4 = 0;
      iVar7 = ioctl(local_10e4,uVar18,local_1038);
      if (iVar7 < 0) {
LAB_0039c42a:
        bVar1 = false;
      }
      else if (local_1024 == 0) {
        if (local_10dc != 0) goto LAB_0039c42a;
        bVar1 = false;
        archive_entry_sparse_add_entry(entry,0,0);
      }
      else {
        if (0 < (int)local_1024) {
          iVar7 = 0;
          pbVar16 = local_ff0;
          do {
            if ((pbVar16[1] & 8) == 0) {
              offset = *(long *)(pbVar16 + -0x28);
              uVar18 = offset + *(long *)(pbVar16 + -0x18);
              lVar17 = 0;
              if (local_10d8 <= uVar18) {
                lVar17 = uVar18 - local_10d8;
              }
              uVar18 = *(long *)(pbVar16 + -0x18) - lVar17;
              bVar1 = uVar18 == local_10d8;
              bVar3 = false;
              if ((!bVar1 || offset != 0) && (bVar3 = bVar2, 0 < (long)uVar18)) {
                archive_entry_sparse_add_entry(entry,offset,uVar18);
              }
              bVar2 = bVar3;
              if (bVar1 && offset == 0) break;
            }
            if ((*pbVar16 & 1) != 0) {
              bVar2 = false;
            }
            iVar7 = iVar7 + 1;
            pbVar16 = pbVar16 + 0x38;
          } while (iVar7 < (int)local_1024);
        }
        uVar18 = local_10d0;
        if (bVar2) {
          local_1038[0] =
               local_1038[(ulong)local_1024 * 7 + -1] +
               local_10c8.__glibc_reserved[(ulong)local_1024 * 7];
          bVar1 = true;
          bVar2 = true;
        }
        else {
          bVar2 = false;
          bVar1 = false;
        }
      }
      local_10dc = local_10dc + 1;
      fd = local_10e0;
    } while (bVar1);
  }
LAB_0039c550:
  if (local_10e4 != fd) {
    close(local_10e4);
  }
  return iVar4;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}